

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  uint8_t *__s;
  uint8_t uVar1;
  uint8_t uVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  puVar6 = *src;
  iVar4 = 0x32;
  if (1 < (ulong)((long)end - (long)puVar6)) {
    *src = puVar6 + 1;
    uVar1 = *puVar6;
    puVar7 = puVar6 + 2;
    *src = puVar7;
    uVar5 = (ulong)CONCAT11(uVar1,puVar6[1]);
    if ((uVar5 <= (ulong)((long)end - (long)puVar7)) && (uVar5 != 0)) {
      puVar6 = puVar7 + uVar5;
      do {
        *src = puVar7 + 1;
        if ((ulong)((long)puVar6 - (long)(puVar7 + 1)) < 2) {
          return 0x32;
        }
        uVar1 = *puVar7;
        *src = puVar7 + 2;
        uVar2 = puVar7[1];
        __s = puVar7 + 3;
        *src = __s;
        uVar5 = (ulong)CONCAT11(uVar2,puVar7[2]);
        if ((ulong)((long)puVar6 - (long)__s) < uVar5) {
          return 0x32;
        }
        if (uVar1 == '\0') {
          pvVar3 = memchr(__s,0,uVar5);
          if (pvVar3 != (void *)0x0) {
            return 0x2f;
          }
          name->base = __s;
          name->len = uVar5;
        }
        puVar7 = __s + uVar5;
        *src = puVar7;
      } while (puVar7 != puVar6);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *(*src)++;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}